

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

quad<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
           *this,quad<unsigned_short> ra,quad<unsigned_short> rb)

{
  default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  unsigned_short uVar1;
  unsigned_short uVar2;
  anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2 aVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int iVar8;
  quad<unsigned_short> qVar9;
  uint uVar10;
  uint uVar11;
  
  uVar10 = rb.super_triplet<unsigned_short>._2_4_ & 0xffff;
  context = &this->context_run_mode_;
  iVar4 = decode_run_interruption_error(this,context->_M_elems);
  iVar5 = decode_run_interruption_error(this,context->_M_elems);
  iVar6 = decode_run_interruption_error(this,context->_M_elems);
  iVar7 = decode_run_interruption_error(this,context->_M_elems);
  this_00 = &this->traits_;
  uVar11 = rb.super_triplet<unsigned_short>._0_4_ & 0xffff;
  iVar8 = -iVar4;
  if ((ra.super_triplet<unsigned_short>._0_4_ & 0xffff) <= uVar11) {
    iVar8 = iVar4;
  }
  qVar9.super_triplet<unsigned_short>.field_0.v1 =
       default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                 (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 + uVar11);
  iVar8 = -iVar5;
  if ((ra.super_triplet<unsigned_short>._2_4_ & 0xffff) <= uVar10) {
    iVar8 = iVar5;
  }
  uVar1 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 + uVar10);
  uVar10 = rb._4_4_ & 0xffff;
  iVar8 = -iVar6;
  if ((ra._4_4_ & 0xffff) <= uVar10) {
    iVar8 = iVar6;
  }
  uVar2 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 + uVar10);
  iVar8 = -iVar7;
  if ((ulong)ra >> 0x30 <= (ulong)rb >> 0x30) {
    iVar8 = iVar7;
  }
  aVar3.v4 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                       (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 +
                                (uint)rb.field_0.v4);
  qVar9.super_triplet<unsigned_short>.field_2.v3 = uVar2;
  qVar9.super_triplet<unsigned_short>.field_1.v2 = uVar1;
  qVar9.field_0.v4 = aVar3.v4;
  return qVar9;
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }